

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mockingboard.hpp
# Opt level: O0

void __thiscall Apple::II::Mockingboard::Mockingboard(Mockingboard *this,AYPair *ays)

{
  AY38910SampleSource<false> *pAVar1;
  AYPair *ays_local;
  Mockingboard *this_local;
  
  Card::Card(&this->super_Card);
  (this->super_Card)._vptr_Card = (_func_int **)&PTR__Mockingboard_00c99810;
  MOS::MOS6522::MOS6522<Apple::II::Mockingboard::AYVIA>::MOS6522(this->vias_,this->handlers_);
  MOS::MOS6522::MOS6522<Apple::II::Mockingboard::AYVIA>::MOS6522
            (this->vias_ + 1,this->handlers_ + 1);
  pAVar1 = AYPair::get(ays,0);
  AYVIA::AYVIA(this->handlers_,this,pAVar1);
  pAVar1 = AYPair::get(ays,1);
  AYVIA::AYVIA(this->handlers_ + 1,this,pAVar1);
  Card::set_select_constraints(&this->super_Card,0);
  return;
}

Assistant:

Mockingboard(AYPair &ays) :
			vias_{ {handlers_[0]}, {handlers_[1]} },
			handlers_{ {*this, ays.get(0)}, {*this, ays.get(1)}} {
			set_select_constraints(0);
		}